

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O1

bool __thiscall
SoftSynthMIDIDevice::ServiceStream(SoftSynthMIDIDevice *this,void *buff,int numbytes)

{
  MIDIHDR *pMVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  double dVar8;
  
  uVar6 = numbytes >> 3;
  memset(buff,0,(long)numbytes);
  FCriticalSection::Enter(&this->CritSec);
  bVar7 = 1;
  do {
    if ((this->Events == (MIDIHDR *)0x0) || ((int)uVar6 < 1)) break;
    dVar8 = this->NextTickIn;
    uVar4 = (uint)dVar8;
    uVar3 = uVar4;
    if ((int)uVar6 < (int)uVar4) {
      uVar3 = uVar6;
    }
    if (0 < (int)uVar4) {
      (*(this->super_MIDIDevice)._vptr_MIDIDevice[0x1d])(this,buff,(ulong)uVar3);
      if (dVar8 != this->NextTickIn) {
        __assert_fail("NextTickIn == ticky",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                      ,0x198,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
      }
      dVar8 = this->NextTickIn - (double)(int)uVar3;
      this->NextTickIn = dVar8;
      if (dVar8 < 0.0) {
        __assert_fail("NextTickIn >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                      ,0x19a,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
      }
      uVar6 = uVar6 - uVar3;
      buff = (void *)((long)buff + (ulong)(uVar3 * 2) * 4);
    }
    bVar2 = true;
    if (this->NextTickIn <= 1.0 && this->NextTickIn != 1.0) {
      iVar5 = PlayTick(this);
      if (iVar5 < 0) {
        __assert_fail("next >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                      ,0x1a2,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
      }
      bVar2 = iVar5 != 0;
      if (iVar5 == 0) {
        if (0 < (int)uVar6) {
          (*(this->super_MIDIDevice)._vptr_MIDIDevice[0x1d])(this,buff,(ulong)uVar6);
        }
        bVar7 = 0;
      }
      else {
        dVar8 = (double)iVar5 * this->SamplesPerTick + this->NextTickIn;
        this->NextTickIn = dVar8;
        if (dVar8 < 0.0) {
          __assert_fail("NextTickIn >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_softsynth_mididevice.cpp"
                        ,0x1af,"virtual bool SoftSynthMIDIDevice::ServiceStream(void *, int)");
        }
      }
    }
  } while (bVar2);
  pMVar1 = this->Events;
  FCriticalSection::Leave(&this->CritSec);
  return (bool)(pMVar1 != (MIDIHDR *)0x0 & bVar7);
}

Assistant:

bool SoftSynthMIDIDevice::ServiceStream (void *buff, int numbytes)
{
	float *samples = (float *)buff;
	float *samples1;
	int numsamples = numbytes / sizeof(float) / 2;
	bool prev_ended = false;
	bool res = true;

	samples1 = samples;
	memset(buff, 0, numbytes);

	CritSec.Enter();
	while (Events != NULL && numsamples > 0)
	{
		double ticky = NextTickIn;
		int tick_in = int(NextTickIn);
		int samplesleft = MIN(numsamples, tick_in);

		if (samplesleft > 0)
		{
			ComputeOutput(samples1, samplesleft);
			assert(NextTickIn == ticky);
			NextTickIn -= samplesleft;
			assert(NextTickIn >= 0);
			numsamples -= samplesleft;
			samples1 += samplesleft * 2;
		}
		
		if (NextTickIn < 1)
		{
			int next = PlayTick();
			assert(next >= 0);
			if (next == 0)
			{ // end of song
				if (numsamples > 0)
				{
					ComputeOutput(samples1, numsamples);
				}
				res = false;
				break;
			}
			else
			{
				NextTickIn += SamplesPerTick * next;
				assert(NextTickIn >= 0);
			}
		}
	}

	if (Events == NULL)
	{
		res = false;
	}
	CritSec.Leave();
	return res;
}